

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

Test * __thiscall
testing::internal::
ParameterizedTestFactory<bssl::(anonymous_namespace)::SSLVersionTest_SessionPropertiesThreads_Test>
::CreateTest(ParameterizedTestFactory<bssl::(anonymous_namespace)::SSLVersionTest_SessionPropertiesThreads_Test>
             *this)

{
  SSLVersionTest *this_00;
  
  WithParamInterface<bssl::(anonymous_namespace)::VersionParam>::parameter_ = &this->parameter_;
  this_00 = (SSLVersionTest *)operator_new(0x50);
  bssl::anon_unknown_0::SSLVersionTest::SSLVersionTest(this_00);
  (this_00->super_TestWithParam<bssl::(anonymous_namespace)::VersionParam>).super_Test._vptr_Test =
       (_func_int **)&PTR__SSLVersionTest_0043c6e8;
  (this_00->super_TestWithParam<bssl::(anonymous_namespace)::VersionParam>).
  super_WithParamInterface<bssl::(anonymous_namespace)::VersionParam>._vptr_WithParamInterface =
       (_func_int **)&DAT_0043c728;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }